

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

IV_API_CALL_STATUS_T enable_skippb_frames(void *codec_obj,vid_dec_ctx_t *ps_app_ctx)

{
  IV_API_CALL_STATUS_T IVar1;
  undefined8 local_34;
  ivd_ctl_set_config_ip_t s_ctl_ip;
  ivd_ctl_set_config_op_t s_ctl_op;
  
  s_ctl_ip.e_sub_cmd = ps_app_ctx->u4_strd;
  s_ctl_ip.e_vid_dec_mode = 6;
  s_ctl_ip.u4_disp_wd = 0;
  s_ctl_ip.u4_size = 1;
  s_ctl_ip.e_cmd = 0;
  local_34 = 0x70000001c;
  s_ctl_ip.e_frm_skip_mode = IVD_SKIP_IDR;
  IVar1 = ihevcd_cxa_api_function((iv_obj_t *)codec_obj,&local_34,&s_ctl_ip.e_frm_skip_mode);
  if (IVar1 != IV_SUCCESS) {
    puts("Error in Enable SkipPB frames");
  }
  return IVar1;
}

Assistant:

IV_API_CALL_STATUS_T enable_skippb_frames(void *codec_obj,
                                          vid_dec_ctx_t *ps_app_ctx)
{
    ivd_ctl_set_config_ip_t s_ctl_ip;
    ivd_ctl_set_config_op_t s_ctl_op;
    IV_API_CALL_STATUS_T e_dec_status;

    s_ctl_ip.u4_disp_wd = ps_app_ctx->u4_strd;
    s_ctl_ip.e_frm_skip_mode = IVD_SKIP_PB;

    s_ctl_ip.e_frm_out_mode = IVD_DISPLAY_FRAME_OUT;
    s_ctl_ip.e_vid_dec_mode = IVD_DECODE_FRAME;
    s_ctl_ip.e_cmd = IVD_CMD_VIDEO_CTL;
    s_ctl_ip.e_sub_cmd = IVD_CMD_CTL_SETPARAMS;
    s_ctl_ip.u4_size = sizeof(ivd_ctl_set_config_ip_t);
    s_ctl_op.u4_size = sizeof(ivd_ctl_set_config_op_t);

    e_dec_status = ivd_cxa_api_function((iv_obj_t *)codec_obj, (void *)&s_ctl_ip,
                                        (void *)&s_ctl_op);
    if(IV_SUCCESS != e_dec_status)
    {
        printf("Error in Enable SkipPB frames\n");
    }

    return e_dec_status;
}